

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

void __thiscall
Query::Query(Query *this,uint32_t count,vector<Query,_std::allocator<Query>_> *queries)

{
  undefined4 in_ESI;
  vector<Query,_std::allocator<Query>_> *in_RDI;
  pointer *ppQVar1;
  
  *(undefined4 *)
   &(in_RDI->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
    _M_start = 4;
  ppQVar1 = &(in_RDI->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  std::vector<QToken,_std::allocator<QToken>_>::vector
            ((vector<QToken,_std::allocator<QToken>_> *)0x1d181f);
  PrimitiveQuery::PrimitiveQuery
            ((PrimitiveQuery *)
             &in_RDI[1].super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
              super__Vector_impl_data._M_finish,GRAM3,0);
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_ESI;
  std::vector<Query,_std::allocator<Query>_>::vector
            (in_RDI,(vector<Query,_std::allocator<Query>_> *)ppQVar1);
  return;
}

Assistant:

Query::Query(uint32_t count, std::vector<Query> &&queries)
    : type(QueryType::MIN_OF), count(count), queries(std::move(queries)) {}